

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getRanging(void *highs,double *col_cost_up_value,double *col_cost_up_objective,
                         HighsInt *col_cost_up_in_var,HighsInt *col_cost_up_ou_var,
                         double *col_cost_dn_value,double *col_cost_dn_objective,
                         HighsInt *col_cost_dn_in_var,HighsInt *col_cost_dn_ou_var,
                         double *col_bound_up_value,double *col_bound_up_objective,
                         HighsInt *col_bound_up_in_var,HighsInt *col_bound_up_ou_var,
                         double *col_bound_dn_value,double *col_bound_dn_objective,
                         HighsInt *col_bound_dn_in_var,HighsInt *col_bound_dn_ou_var,
                         double *row_bound_up_value,double *row_bound_up_objective,
                         HighsInt *row_bound_up_in_var,HighsInt *row_bound_up_ou_var,
                         double *row_bound_dn_value,double *row_bound_dn_objective,
                         HighsInt *row_bound_dn_in_var,HighsInt *row_bound_dn_ou_var)

{
  HighsStatus HVar1;
  HighsInt HVar2;
  HighsInt HVar3;
  double *pdVar4;
  int *piVar5;
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  Highs *in_RDI;
  void *in_R8;
  void *in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  void *in_stack_00000020;
  void *in_stack_00000028;
  void *in_stack_00000030;
  void *in_stack_00000038;
  void *in_stack_00000040;
  void *in_stack_00000048;
  void *in_stack_00000050;
  void *in_stack_00000058;
  void *in_stack_00000060;
  void *in_stack_00000068;
  void *in_stack_00000070;
  void *in_stack_00000078;
  void *in_stack_00000080;
  void *in_stack_00000088;
  HighsRanging *in_stack_00000090;
  void *in_stack_00000098;
  HighsInt num_row;
  HighsInt num_col;
  HighsInt status;
  HighsRanging ranging;
  HighsRanging *in_stack_fffffffffffffc90;
  HighsRanging *in_stack_fffffffffffffc98;
  Highs *in_stack_fffffffffffffca0;
  
  HighsRanging::HighsRanging(in_stack_fffffffffffffc90);
  HVar1 = Highs::getRanging(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  if (HVar1 != kError) {
    HVar2 = Highs::getNumCol(in_RDI);
    HVar3 = Highs::getNumRow(in_RDI);
    if (in_RSI != (void *)0x0) {
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43b7a2);
      memcpy(in_RSI,pdVar4,(long)HVar2 << 3);
    }
    if (in_RDX != (void *)0x0) {
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43b7ee);
      memcpy(in_RDX,pdVar4,(long)HVar2 << 3);
    }
    if (in_RCX != (void *)0x0) {
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x43b83a);
      memcpy(in_RCX,piVar5,(long)HVar2 << 2);
    }
    if (in_R8 != (void *)0x0) {
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x43b886);
      memcpy(in_R8,piVar5,(long)HVar2 << 2);
    }
    if (in_R9 != (void *)0x0) {
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43b8ce);
      memcpy(in_R9,pdVar4,(long)HVar2 << 3);
    }
    if (in_stack_00000008 != (void *)0x0) {
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43b91a);
      memcpy(in_stack_00000008,pdVar4,(long)HVar2 << 3);
    }
    if (in_stack_00000010 != (void *)0x0) {
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x43b966);
      memcpy(in_stack_00000010,piVar5,(long)HVar2 << 2);
    }
    if (in_stack_00000018 != (void *)0x0) {
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x43b9b2);
      memcpy(in_stack_00000018,piVar5,(long)HVar2 << 2);
    }
    if (in_stack_00000020 != (void *)0x0) {
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43b9fa);
      memcpy(in_stack_00000020,pdVar4,(long)HVar2 << 3);
    }
    if (in_stack_00000028 != (void *)0x0) {
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43ba43);
      memcpy(in_stack_00000028,pdVar4,(long)HVar2 << 3);
    }
    if (in_stack_00000030 != (void *)0x0) {
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x43ba8c);
      memcpy(in_stack_00000030,piVar5,(long)HVar2 << 2);
    }
    if (in_stack_00000038 != (void *)0x0) {
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x43bad5);
      memcpy(in_stack_00000038,piVar5,(long)HVar2 << 2);
    }
    if (in_stack_00000040 != (void *)0x0) {
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43bb1a);
      memcpy(in_stack_00000040,pdVar4,(long)HVar2 << 3);
    }
    if (in_stack_00000048 != (void *)0x0) {
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43bb63);
      memcpy(in_stack_00000048,pdVar4,(long)HVar2 << 3);
    }
    if (in_stack_00000050 != (void *)0x0) {
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x43bbac);
      memcpy(in_stack_00000050,piVar5,(long)HVar2 << 2);
    }
    if (in_stack_00000058 != (void *)0x0) {
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x43bbf5);
      memcpy(in_stack_00000058,piVar5,(long)HVar2 << 2);
    }
    if (in_stack_00000060 != (void *)0x0) {
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43bc3a);
      memcpy(in_stack_00000060,pdVar4,(long)HVar3 << 3);
    }
    if (in_stack_00000068 != (void *)0x0) {
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43bc83);
      memcpy(in_stack_00000068,pdVar4,(long)HVar3 << 3);
    }
    if (in_stack_00000070 != (void *)0x0) {
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x43bccc);
      memcpy(in_stack_00000070,piVar5,(long)HVar3 << 2);
    }
    if (in_stack_00000078 != (void *)0x0) {
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x43bd15);
      memcpy(in_stack_00000078,piVar5,(long)HVar3 << 2);
    }
    if (in_stack_00000080 != (void *)0x0) {
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43bd5a);
      memcpy(in_stack_00000080,pdVar4,(long)HVar3 << 3);
    }
    if (in_stack_00000088 != (void *)0x0) {
      pdVar4 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x43bda3);
      memcpy(in_stack_00000088,pdVar4,(long)HVar3 << 3);
    }
    if (in_stack_00000090 != (HighsRanging *)0x0) {
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x43bdec);
      memcpy(in_stack_00000090,piVar5,(long)HVar3 << 2);
      in_stack_fffffffffffffc90 = in_stack_00000090;
    }
    if (in_stack_00000098 != (void *)0x0) {
      piVar5 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x43be34);
      memcpy(in_stack_00000098,piVar5,(long)HVar3 << 2);
    }
  }
  HighsRanging::~HighsRanging(in_stack_fffffffffffffc90);
  return HVar1;
}

Assistant:

HighsInt Highs_getRanging(
    void* highs,
    //
    double* col_cost_up_value, double* col_cost_up_objective,
    HighsInt* col_cost_up_in_var, HighsInt* col_cost_up_ou_var,
    double* col_cost_dn_value, double* col_cost_dn_objective,
    HighsInt* col_cost_dn_in_var, HighsInt* col_cost_dn_ou_var,
    double* col_bound_up_value, double* col_bound_up_objective,
    HighsInt* col_bound_up_in_var, HighsInt* col_bound_up_ou_var,
    double* col_bound_dn_value, double* col_bound_dn_objective,
    HighsInt* col_bound_dn_in_var, HighsInt* col_bound_dn_ou_var,
    double* row_bound_up_value, double* row_bound_up_objective,
    HighsInt* row_bound_up_in_var, HighsInt* row_bound_up_ou_var,
    double* row_bound_dn_value, double* row_bound_dn_objective,
    HighsInt* row_bound_dn_in_var, HighsInt* row_bound_dn_ou_var) {
  HighsRanging ranging;
  HighsInt status = (HighsInt)((Highs*)highs)->getRanging(ranging);
  if (status == (HighsInt)HighsStatus::kError) return status;
  HighsInt num_col = ((Highs*)highs)->getNumCol();
  HighsInt num_row = ((Highs*)highs)->getNumRow();
  if (col_cost_up_value)
    memcpy(col_cost_up_value, ranging.col_cost_up.value_.data(),
           num_col * sizeof(double));
  if (col_cost_up_objective)
    memcpy(col_cost_up_objective, ranging.col_cost_up.objective_.data(),
           num_col * sizeof(double));
  if (col_cost_up_in_var)
    memcpy(col_cost_up_in_var, ranging.col_cost_up.in_var_.data(),
           num_col * sizeof(HighsInt));
  if (col_cost_up_ou_var)
    memcpy(col_cost_up_ou_var, ranging.col_cost_up.ou_var_.data(),
           num_col * sizeof(HighsInt));

  if (col_cost_dn_value)
    memcpy(col_cost_dn_value, ranging.col_cost_dn.value_.data(),
           num_col * sizeof(double));
  if (col_cost_dn_objective)
    memcpy(col_cost_dn_objective, ranging.col_cost_dn.objective_.data(),
           num_col * sizeof(double));
  if (col_cost_dn_in_var)
    memcpy(col_cost_dn_in_var, ranging.col_cost_dn.in_var_.data(),
           num_col * sizeof(HighsInt));
  if (col_cost_dn_ou_var)
    memcpy(col_cost_dn_ou_var, ranging.col_cost_dn.ou_var_.data(),
           num_col * sizeof(HighsInt));

  if (col_bound_up_value)
    memcpy(col_bound_up_value, ranging.col_bound_up.value_.data(),
           num_col * sizeof(double));
  if (col_bound_up_objective)
    memcpy(col_bound_up_objective, ranging.col_bound_up.objective_.data(),
           num_col * sizeof(double));
  if (col_bound_up_in_var)
    memcpy(col_bound_up_in_var, ranging.col_bound_up.in_var_.data(),
           num_col * sizeof(HighsInt));
  if (col_bound_up_ou_var)
    memcpy(col_bound_up_ou_var, ranging.col_bound_up.ou_var_.data(),
           num_col * sizeof(HighsInt));

  if (col_bound_dn_value)
    memcpy(col_bound_dn_value, ranging.col_bound_dn.value_.data(),
           num_col * sizeof(double));
  if (col_bound_dn_objective)
    memcpy(col_bound_dn_objective, ranging.col_bound_dn.objective_.data(),
           num_col * sizeof(double));
  if (col_bound_dn_in_var)
    memcpy(col_bound_dn_in_var, ranging.col_bound_dn.in_var_.data(),
           num_col * sizeof(HighsInt));
  if (col_bound_dn_ou_var)
    memcpy(col_bound_dn_ou_var, ranging.col_bound_dn.ou_var_.data(),
           num_col * sizeof(HighsInt));

  if (row_bound_up_value)
    memcpy(row_bound_up_value, ranging.row_bound_up.value_.data(),
           num_row * sizeof(double));
  if (row_bound_up_objective)
    memcpy(row_bound_up_objective, ranging.row_bound_up.objective_.data(),
           num_row * sizeof(double));
  if (row_bound_up_in_var)
    memcpy(row_bound_up_in_var, ranging.row_bound_up.in_var_.data(),
           num_row * sizeof(HighsInt));
  if (row_bound_up_ou_var)
    memcpy(row_bound_up_ou_var, ranging.row_bound_up.ou_var_.data(),
           num_row * sizeof(HighsInt));

  if (row_bound_dn_value)
    memcpy(row_bound_dn_value, ranging.row_bound_dn.value_.data(),
           num_row * sizeof(double));
  if (row_bound_dn_objective)
    memcpy(row_bound_dn_objective, ranging.row_bound_dn.objective_.data(),
           num_row * sizeof(double));
  if (row_bound_dn_in_var)
    memcpy(row_bound_dn_in_var, ranging.row_bound_dn.in_var_.data(),
           num_row * sizeof(HighsInt));
  if (row_bound_dn_ou_var)
    memcpy(row_bound_dn_ou_var, ranging.row_bound_dn.ou_var_.data(),
           num_row * sizeof(HighsInt));

  return status;
}